

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void SaveOpndValue(ParseNode *pnode,FuncInfo *funcInfo)

{
  RegSlot RVar1;
  ParseNodeUni *pPVar2;
  ParseNodeName *pPVar3;
  Symbol *pSVar4;
  ParseNodePtr this;
  
  this = pnode;
  if (pnode->nop == knopName) {
LAB_008198ba:
    pPVar3 = ParseNode::AsParseNodeName(this);
    pSVar4 = pPVar3->sym;
  }
  else {
    if (pnode->nop == knopComputedName) {
      pPVar2 = ParseNode::AsParseNodeUni(pnode);
      this = pPVar2->pnode1;
      if (this->nop == knopName) goto LAB_008198ba;
    }
    pSVar4 = (Symbol *)0x0;
  }
  if ((((pSVar4 != (Symbol *)0x0) && (pnode->location != 0xffffffff)) &&
      (pSVar4->scope->func == funcInfo)) && (pnode->location == pSVar4->location)) {
    RVar1 = FuncInfo::AcquireTmpRegister(funcInfo);
    pnode->location = RVar1;
  }
  return;
}

Assistant:

void SaveOpndValue(ParseNode *pnode, FuncInfo *funcInfo)
{
    // Save a local name to a register other than its home location.
    // This guards against side-effects in cases like x.foo(x = bar()).
    Symbol *sym = nullptr;
    if (pnode->nop == knopName)
    {
        sym = pnode->AsParseNodeName()->sym;
    }
    else if (pnode->nop == knopComputedName)
    {
        ParseNode *pnode1 = pnode->AsParseNodeUni()->pnode1;
        if (pnode1->nop == knopName)
        {
            sym = pnode1->AsParseNodeName()->sym;
        }
    }

    if (sym == nullptr)
    {
        return;
    }

    // If the target is a local being kept in its home location,
    // protect the target's value in the event the home location is overwritten.
    if (pnode->location != Js::Constants::NoRegister &&
        sym->GetScope()->GetFunc() == funcInfo &&
        pnode->location == sym->GetLocation())
    {
        pnode->location = funcInfo->AcquireTmpRegister();
    }
}